

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void ssh_bpp_input_raw_data_callback(void *context)

{
  Ssh *ssh_00;
  Ssh *ssh;
  BinaryPacketProtocol *bpp;
  void *context_local;
  
  ssh_00 = *(Ssh **)((long)context + 0xa0);
  ssh_bpp_handle_input((BinaryPacketProtocol *)context);
  ssh_conn_processed_data(ssh_00);
  return;
}

Assistant:

static void ssh_bpp_input_raw_data_callback(void *context)
{
    BinaryPacketProtocol *bpp = (BinaryPacketProtocol *)context;
    Ssh *ssh = bpp->ssh;               /* in case bpp is about to get freed */
    ssh_bpp_handle_input(bpp);
    /* If we've now cleared enough backlog on the input connection, we
     * may need to unfreeze it. */
    ssh_conn_processed_data(ssh);
}